

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O0

void aom_highbd_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i qcoeff_03;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  undefined1 (*in_RCX) [16];
  undefined8 *puVar26;
  undefined1 (*in_RDX) [16];
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong lVar27;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong in_RSI;
  int16_t *iscan_ptr;
  ulong *in_RDI;
  ulong *puVar28;
  __m128i *cmp_mask0_00;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  ulong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  ulong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  ulong extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  int iVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i alVar45;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i mask;
  __m128i mask_00;
  __m128i sign;
  __m128i sign_00;
  __m128i sign_01;
  __m128i sign_02;
  __m128i sign_03;
  __m128i sign_04;
  __m128i sign_05;
  __m128i sign_06;
  ulong *in_stack_00000008;
  ulong *in_stack_00000010;
  undefined1 (*in_stack_00000018) [16];
  ushort *in_stack_00000020;
  long in_stack_00000028;
  int prescan_add_val;
  int factor;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc_3;
  int qcoeff;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  __m128i shift_sign;
  __m128i dequant_sign;
  __m128i quant_sign;
  __m128i round_sign;
  __m128i zbin_sign;
  int first;
  __m128i threshold [2];
  int i;
  qm_val_t wt;
  int thresh [4];
  int prescan_add [2];
  __m128i mask1;
  __m128i mask0;
  __m128i all_zero;
  __m128i cmp_mask;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1_sign;
  __m128i coeff0_sign;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  __m128i one;
  __m128i zero;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int log_scale;
  int index;
  int *in_stack_fffffffffffff648;
  undefined4 in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff654;
  undefined4 in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  undefined4 in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff66c;
  undefined4 in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff674;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  __m128i *qcoeff0_00;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  int local_91c;
  undefined4 local_908;
  int local_8f0;
  uint local_8e8 [6];
  int aiStack_8d0 [2];
  longlong local_8c8 [5];
  ulong uStack_8a0;
  __m128i local_898;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_878;
  int iStack_874;
  int iStack_870;
  int iStack_86c;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong uStack_850;
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  int local_838;
  int iStack_834;
  int iStack_830;
  int iStack_82c;
  ulong local_828;
  ulong uStack_820;
  ulong local_818;
  ulong uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined4 local_7e8;
  undefined2 uStack_7e4;
  undefined2 uStack_7e2;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  ulong local_7a8;
  ulong uStack_7a0;
  int local_794;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  undefined1 (*local_760) [16];
  longlong local_758;
  ulong *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined4 local_734;
  uint *local_730;
  undefined8 local_728;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined4 uStack_70c;
  undefined8 local_708;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  undefined4 local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6ec;
  undefined4 local_6e8;
  undefined4 uStack_6e4;
  undefined4 uStack_6e0;
  undefined4 uStack_6dc;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6cc;
  undefined8 local_6c8;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6ac;
  undefined8 local_6a8;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_68c;
  undefined4 local_688;
  undefined4 uStack_684;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  undefined4 local_678;
  undefined4 uStack_674;
  undefined4 uStack_66c;
  undefined4 local_668;
  undefined4 uStack_664;
  undefined4 uStack_660;
  undefined4 uStack_65c;
  undefined4 local_658;
  undefined4 uStack_654;
  undefined4 uStack_64c;
  undefined8 local_648;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_62c;
  undefined8 local_628;
  int iStack_620;
  int iStack_61c;
  undefined4 local_618;
  int iStack_614;
  int iStack_60c;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_5fc;
  undefined4 uStack_5ec;
  ulong *local_5e8;
  ulong *local_5e0;
  ulong *local_5d8;
  undefined4 local_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined4 local_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined4 local_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined4 local_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined4 local_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined4 local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong *local_290;
  ulong *local_270;
  ulong local_268;
  ulong uStack_260;
  ulong *local_250;
  ulong local_248;
  ulong uStack_240;
  ulong *local_230;
  ulong local_228;
  ulong uStack_220;
  ulong *local_210;
  ulong local_208;
  ulong uStack_200;
  ulong *local_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong *local_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong *local_1b0;
  ulong *local_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_168;
  ulong uStack_160;
  ulong *local_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_128;
  ulong uStack_120;
  ulong *local_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_e8;
  ulong uStack_e0;
  ulong *local_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  undefined1 (*pauVar25) [16];
  undefined8 uVar44;
  
  local_77c = 8;
  local_780 = 0;
  local_784 = 0;
  local_788 = 0;
  local_78c = 0;
  local_790 = 0;
  local_794 = -1;
  local_748 = 0;
  uStack_740 = 0;
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_734 = 1;
  local_4 = 1;
  local_8 = 1;
  local_c = 1;
  local_10 = 1;
  local_7b8 = 1;
  uStack_7b4 = 1;
  uStack_7b0 = 1;
  uStack_7ac = 1;
  local_8c8[2] = 0;
  local_8c8[3] = 0;
  local_8c8[0] = 0;
  local_8c8[1] = 0;
  pauVar25 = in_RCX;
  for (local_8f0 = 0; local_8f0 < 2; local_8f0 = local_8f0 + 1) {
    aiStack_8d0[local_8f0] =
         *(short *)(*in_stack_00000018 + (long)local_8f0 * 2) * 0x145 + 0x40 >> 7;
    uVar24 = (*(short *)(*in_RDX + (long)local_8f0 * 2) * 0x20 + aiStack_8d0[local_8f0]) - 1;
    pauVar25 = (undefined1 (*) [16])(ulong)uVar24;
    local_8e8[local_8f0] = uVar24;
  }
  local_8e8[3] = local_8e8[1];
  local_8e8[2] = local_8e8[1];
  local_730 = local_8e8;
  uStack_604 = local_8e8[1];
  uStack_5ec = local_8e8[1];
  local_5e8 = (ulong *)CONCAT44(local_5e8._4_4_,local_908);
  uStack_5fc = local_8e8[1];
  local_91c = -1;
  local_518 = *(undefined8 *)*in_RDX;
  uStack_510 = *(undefined8 *)(*in_RDX + 8);
  local_538 = *(undefined8 *)*in_RCX;
  uStack_530 = *(undefined8 *)(*in_RCX + 8);
  local_558 = *(undefined8 *)*in_R8;
  uStack_550 = *(undefined8 *)(*in_R8 + 8);
  local_578 = *(undefined8 *)*in_stack_00000018;
  uStack_570 = *(undefined8 *)(*in_stack_00000018 + 8);
  local_598 = *(undefined8 *)*in_R9;
  uStack_590 = *(undefined8 *)(*in_R9 + 8);
  local_51c = 0xf;
  auVar29 = psraw(*in_RDX,ZEXT416(0xf));
  local_53c = 0xf;
  auVar30 = psraw(*in_RCX,ZEXT416(0xf));
  local_55c = 0xf;
  auVar31 = psraw(*in_R8,ZEXT416(0xf));
  local_57c = 0xf;
  auVar32 = psraw(*in_stack_00000018,ZEXT416(0xf));
  local_59c = 0xf;
  auVar33 = psraw(*in_R9,ZEXT416(0xf));
  local_938 = auVar29._0_8_;
  uStack_930 = auVar29._8_8_;
  local_488 = local_938;
  uVar16 = local_488;
  uStack_480 = uStack_930;
  local_478._0_2_ = (undefined2)local_518;
  local_478._2_2_ = (undefined2)((ulong)local_518 >> 0x10);
  local_478._4_2_ = (undefined2)((ulong)local_518 >> 0x20);
  local_478._6_2_ = (undefined2)((ulong)local_518 >> 0x30);
  local_488._0_2_ = auVar29._0_2_;
  local_488._2_2_ = auVar29._2_2_;
  local_488._4_2_ = auVar29._4_2_;
  local_488._6_2_ = auVar29._6_2_;
  local_7c8._0_4_ = CONCAT22((undefined2)local_488,(undefined2)local_478);
  local_7c8 = CONCAT26(local_488._2_2_,CONCAT24(local_478._2_2_,(int)local_7c8));
  uStack_7c0._0_4_ = CONCAT22(local_488._4_2_,local_478._4_2_);
  uStack_7c0 = CONCAT26(local_488._6_2_,CONCAT24(local_478._6_2_,(int)uStack_7c0));
  local_948 = auVar30._0_8_;
  uStack_940 = auVar30._8_8_;
  local_4a8 = local_948;
  uVar15 = local_4a8;
  uStack_4a0 = uStack_940;
  local_498._0_2_ = (undefined2)local_538;
  local_498._2_2_ = (undefined2)((ulong)local_538 >> 0x10);
  local_498._4_2_ = (undefined2)((ulong)local_538 >> 0x20);
  local_498._6_2_ = (undefined2)((ulong)local_538 >> 0x30);
  local_4a8._0_2_ = auVar30._0_2_;
  local_4a8._2_2_ = auVar30._2_2_;
  local_4a8._4_2_ = auVar30._4_2_;
  local_4a8._6_2_ = auVar30._6_2_;
  local_7d8._0_4_ = CONCAT22((undefined2)local_4a8,(undefined2)local_498);
  local_7d8 = CONCAT26(local_4a8._2_2_,CONCAT24(local_498._2_2_,(undefined4)local_7d8));
  uStack_7d0 = CONCAT26(local_4a8._6_2_,
                        CONCAT24(local_498._6_2_,CONCAT22(local_4a8._4_2_,local_498._4_2_)));
  local_958 = auVar31._0_8_;
  uStack_950 = auVar31._8_8_;
  local_4c8 = local_958;
  uVar14 = local_4c8;
  uStack_4c0 = uStack_950;
  local_4b8._0_2_ = (undefined2)local_558;
  local_4b8._2_2_ = (undefined2)((ulong)local_558 >> 0x10);
  local_4b8._4_2_ = (undefined2)((ulong)local_558 >> 0x20);
  local_4b8._6_2_ = (undefined2)((ulong)local_558 >> 0x30);
  local_4c8._0_2_ = auVar31._0_2_;
  local_4c8._2_2_ = auVar31._2_2_;
  local_4c8._4_2_ = auVar31._4_2_;
  local_4c8._6_2_ = auVar31._6_2_;
  local_7e8 = CONCAT22((undefined2)local_4c8,(undefined2)local_4b8);
  _local_7e8 = CONCAT26(local_4c8._2_2_,CONCAT24(local_4b8._2_2_,local_7e8));
  uStack_7e0 = CONCAT26(local_4c8._6_2_,
                        CONCAT24(local_4b8._6_2_,CONCAT22(local_4c8._4_2_,local_4b8._4_2_)));
  local_968 = auVar32._0_8_;
  uStack_960 = auVar32._8_8_;
  local_4e8 = local_968;
  uVar44 = local_4e8;
  uStack_4e0 = uStack_960;
  local_4d8._0_2_ = (undefined2)local_578;
  local_4d8._2_2_ = (undefined2)((ulong)local_578 >> 0x10);
  local_4d8._4_2_ = (undefined2)((ulong)local_578 >> 0x20);
  local_4d8._6_2_ = (undefined2)((ulong)local_578 >> 0x30);
  local_4e8._0_2_ = auVar32._0_2_;
  local_4e8._2_2_ = auVar32._2_2_;
  local_4e8._4_2_ = auVar32._4_2_;
  local_4e8._6_2_ = auVar32._6_2_;
  local_7f8._0_4_ = CONCAT22((undefined2)local_4e8,(undefined2)local_4d8);
  local_7f8 = CONCAT26(local_4e8._2_2_,CONCAT24(local_4d8._2_2_,(undefined4)local_7f8));
  uStack_7f0._0_4_ = CONCAT22(local_4e8._4_2_,local_4d8._4_2_);
  uStack_7f0 = CONCAT26(local_4e8._6_2_,CONCAT24(local_4d8._6_2_,(undefined4)uStack_7f0));
  qcoeff0_00 = auVar33._0_8_;
  uStack_970 = auVar33._8_8_;
  uStack_500 = uStack_970;
  local_4f8._0_2_ = (undefined2)local_598;
  local_4f8._2_2_ = (undefined2)((ulong)local_598 >> 0x10);
  local_4f8._4_2_ = (undefined2)((ulong)local_598 >> 0x20);
  local_4f8._6_2_ = (undefined2)((ulong)local_598 >> 0x30);
  local_508._0_2_ = auVar33._0_2_;
  local_508._2_2_ = auVar33._2_2_;
  local_508._4_2_ = auVar33._4_2_;
  local_508._6_2_ = auVar33._6_2_;
  local_808 = CONCAT26(local_508._2_2_,
                       CONCAT24(local_4f8._2_2_,
                                CONCAT22((undefined2)local_508,(undefined2)local_4f8)));
  uStack_800 = CONCAT26(local_508._6_2_,
                        CONCAT24(local_4f8._6_2_,CONCAT22(local_508._4_2_,local_4f8._4_2_)));
  local_458 = local_7c8;
  uVar17 = local_458;
  uStack_450 = uStack_7c0;
  uVar18 = uStack_450;
  local_468 = 1;
  uStack_464 = 1;
  uStack_460 = 1;
  uStack_45c = 1;
  local_458._4_4_ = (int)((ulong)local_7c8 >> 0x20);
  uStack_450._4_4_ = (int)((ulong)uStack_7c0 >> 0x20);
  local_7c8 = CONCAT44(local_458._4_4_ + -1,(int)local_7c8 + -1);
  uStack_7c0 = CONCAT44(uStack_450._4_4_ + -1,(int)uStack_7c0 + -1);
  local_818 = *in_RDI;
  uStack_810 = in_RDI[1];
  local_5d8 = in_RDI + 2;
  local_828 = *local_5d8;
  uStack_820 = in_RDI[3];
  local_3dc = 0x1f;
  local_3d8._0_4_ = (int)local_818;
  local_3d8._4_4_ = (int)(local_818 >> 0x20);
  uStack_3d0._0_4_ = (int)uStack_810;
  uStack_3d0._4_4_ = (int)(uStack_810 >> 0x20);
  auVar29 = ZEXT416(0x1f);
  local_838 = (int)local_3d8 >> auVar29;
  iStack_834 = local_3d8._4_4_ >> auVar29;
  iStack_830 = (int)uStack_3d0 >> auVar29;
  iStack_82c = uStack_3d0._4_4_ >> auVar29;
  local_3fc = 0x1f;
  local_3f8._0_4_ = (int)local_828;
  local_3f8._4_4_ = (int)(local_828 >> 0x20);
  uStack_3f0._0_4_ = (int)uStack_820;
  uStack_3f0._4_4_ = (int)(uStack_820 >> 0x20);
  auVar29 = ZEXT416(0x1f);
  local_848 = (int)local_3f8 >> auVar29;
  iStack_844 = local_3f8._4_4_ >> auVar29;
  iStack_840 = (int)uStack_3f0 >> auVar29;
  iStack_83c = uStack_3f0._4_4_ >> auVar29;
  alVar45[1] = in_RSI;
  alVar45[0] = (longlong)in_RDI;
  sign[1] = (longlong)pauVar25;
  sign[0] = (longlong)in_RDX;
  local_760 = in_RDX;
  local_758 = in_RSI;
  local_750 = in_RDI;
  local_508 = qcoeff0_00;
  local_4f8 = local_598;
  uStack_4f0 = uStack_590;
  local_4e8 = uVar44;
  local_4d8 = local_578;
  uStack_4d0 = uStack_570;
  local_4c8 = uVar14;
  local_4b8 = local_558;
  uStack_4b0 = uStack_550;
  local_4a8 = uVar15;
  local_498 = local_538;
  uStack_490 = uStack_530;
  local_488 = uVar16;
  local_478 = local_518;
  uStack_470 = uStack_510;
  local_458 = uVar17;
  uStack_450 = uVar18;
  local_3f8 = local_828;
  uStack_3f0 = uStack_820;
  local_3d8 = local_818;
  uStack_3d0 = uStack_810;
  local_28 = local_7b8;
  uStack_24 = uStack_7b4;
  uStack_20 = uStack_7b0;
  uStack_1c = uStack_7ac;
  alVar45 = invert_sign_32_sse2(alVar45,sign);
  sign_00[0] = alVar45[1];
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  sign_00[1] = (longlong)pauVar25;
  local_858 = extraout_XMM0_Qa;
  uStack_850 = extraout_XMM0_Qb;
  invert_sign_32_sse2(a,sign_00);
  local_868 = extraout_XMM0_Qa_00;
  uStack_860 = extraout_XMM0_Qb_00;
  highbd_update_mask0(qcoeff0_00,
                      (__m128i *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                      (__m128i *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                      (int16_t *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                      (int *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                      (__m128i *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
  local_358 = local_858;
  uVar20 = local_358;
  uStack_350 = uStack_850;
  uVar21 = uStack_350;
  local_368 = local_7c8;
  uStack_360 = uStack_7c0;
  local_358._0_4_ = (int)local_858;
  local_358._4_4_ = (int)(local_858 >> 0x20);
  uStack_350._0_4_ = (int)uStack_850;
  uStack_350._4_4_ = (int)(uStack_850 >> 0x20);
  iVar42 = (int)((ulong)local_7c8 >> 0x20);
  auVar32._12_4_ = (int)((ulong)uStack_7c0 >> 0x20);
  local_878 = -(uint)((int)local_7c8 < (int)local_358);
  iStack_874 = -(uint)(iVar42 < local_358._4_4_);
  iStack_870 = -(uint)((int)uStack_7c0 < (int)uStack_350);
  iStack_86c = -(uint)(auVar32._12_4_ < uStack_350._4_4_);
  _local_608 = CONCAT44(uStack_604,local_7b8);
  local_628 = local_7c8;
  _local_618 = CONCAT44(iVar42,local_7b8);
  auVar1._4_8_ = uStack_7c0;
  auVar1._0_4_ = iVar42;
  auVar32._0_8_ = auVar1._0_8_ << 0x20;
  auVar32._8_4_ = iStack_620;
  uStack_7c0 = auVar32._8_8_;
  local_378 = local_868;
  uVar43 = local_378;
  uStack_370 = uStack_860;
  uVar19 = uStack_370;
  local_388 = local_7c8;
  local_378._0_4_ = (int)local_868;
  local_378._4_4_ = (int)(local_868 >> 0x20);
  uStack_370._0_4_ = (int)uStack_860;
  uStack_370._4_4_ = (int)(uStack_860 >> 0x20);
  local_888 = -(uint)((int)local_7c8 < (int)local_378);
  iStack_884 = -(uint)(iVar42 < local_378._4_4_);
  iStack_880 = -(uint)(iStack_620 < (int)uStack_370);
  iStack_87c = -(uint)(auVar32._12_4_ < uStack_370._4_4_);
  local_318 = CONCAT44(iStack_874,local_878);
  uStack_310 = CONCAT44(iStack_86c,iStack_870);
  local_328 = CONCAT44(iStack_884,local_888);
  uStack_320 = CONCAT44(iStack_87c,iStack_880);
  auVar30._8_8_ = uStack_310;
  auVar30._0_8_ = local_318;
  auVar29._8_8_ = uStack_320;
  auVar29._0_8_ = local_328;
  local_898 = (__m128i)packssdw(auVar30,auVar29);
  cmp_mask0_00 = &local_898;
  iscan_ptr = _factor;
  iStack_61c = auVar32._12_4_;
  iStack_60c = auVar32._12_4_;
  uStack_380 = uStack_7c0;
  local_378 = uVar43;
  uStack_370 = uVar19;
  local_358 = uVar20;
  uStack_350 = uVar21;
  highbd_update_mask1(cmp_mask0_00,_factor,&local_790,(__m128i *)local_8c8);
  local_2d8 = CONCAT44(iStack_874,local_878);
  uVar43 = CONCAT44(iStack_86c,iStack_870);
  local_2e8 = CONCAT44(iStack_884,local_888);
  uStack_2e0 = CONCAT44(iStack_87c,iStack_880);
  local_8c8[4] = local_2d8 | local_2e8;
  uStack_8a0 = uVar43 | uStack_2e0;
  auVar31._8_8_ = uStack_8a0;
  auVar31._0_8_ = local_8c8[4];
  uStack_2d0 = uVar43;
  local_2b8 = local_8c8[4];
  uStack_2b0 = uStack_8a0;
  if ((((((((((((((((auVar31 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar31 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar31 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar31 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar31 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar31 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uStack_8a0 >> 7 & 1) == 0) && (uStack_8a0 >> 0xf & 1) == 0) &&
          (uStack_8a0 >> 0x17 & 1) == 0) && (uStack_8a0 >> 0x1f & 1) == 0) &&
        (uStack_8a0 >> 0x27 & 1) == 0) && (uStack_8a0 >> 0x2f & 1) == 0) &&
      (uStack_8a0 >> 0x37 & 1) == 0) && -1 < (long)uStack_8a0) {
    local_c8 = local_7a8;
    uStack_c0 = uStack_7a0;
    *in_stack_00000008 = local_7a8;
    in_stack_00000008[1] = uStack_7a0;
    local_d0 = in_stack_00000008 + 2;
    local_e8 = local_7a8;
    uStack_e0 = uStack_7a0;
    *local_d0 = local_7a8;
    in_stack_00000008[3] = uStack_7a0;
    local_108 = local_7a8;
    uStack_100 = uStack_7a0;
    *in_stack_00000010 = local_7a8;
    in_stack_00000010[1] = uStack_7a0;
    local_110 = in_stack_00000010 + 2;
    local_128 = local_7a8;
    uStack_120 = uStack_7a0;
    *local_110 = local_7a8;
    in_stack_00000010[3] = uStack_7a0;
    uStack_62c = uStack_7d0._4_4_;
    local_628 = CONCAT44(local_628._4_4_,(int)local_7c8);
    uStack_63c = uStack_7d0._4_4_;
    uStack_634 = (undefined4)((ulong)local_7d8 >> 0x20);
    _local_638 = CONCAT44(uStack_634,(int)local_7c8);
    auVar2._4_8_ = uVar43;
    auVar2._0_4_ = uStack_634;
    auVar34._0_8_ = auVar2._0_8_ << 0x20;
    auVar34._8_4_ = uStack_640;
    auVar34._12_4_ = uStack_7d0._4_4_;
    uStack_7d0 = auVar34._8_8_;
    uStack_64c = uStack_7e0._4_4_;
    local_648 = local_7d8;
    uStack_65c = uStack_7e0._4_4_;
    uStack_654 = (undefined4)((ulong)_local_7e8 >> 0x20);
    _local_658 = CONCAT44(uStack_654,(undefined4)local_7d8);
    auVar3._4_8_ = uStack_7d0;
    auVar3._0_4_ = uStack_654;
    auVar35._0_8_ = auVar3._0_8_ << 0x20;
    auVar35._8_4_ = uStack_660;
    auVar35._12_4_ = uStack_7e0._4_4_;
    uStack_7e0 = auVar35._8_8_;
    uStack_66c = uStack_800._4_4_;
    _local_668 = CONCAT44(uStack_654,(undefined4)local_7f8);
    uStack_67c = uStack_800._4_4_;
    uStack_674 = (undefined4)((ulong)local_808 >> 0x20);
    _local_678 = CONCAT44(uStack_674,(undefined4)local_7f8);
    auVar4._4_8_ = uStack_7e0;
    auVar4._0_4_ = uStack_674;
    auVar36._0_8_ = auVar4._0_8_ << 0x20;
    auVar36._8_4_ = uStack_680;
    auVar36._12_4_ = uStack_800._4_4_;
    uStack_800 = auVar36._8_8_;
    uStack_68c = uStack_7f0._4_4_;
    _local_688 = CONCAT44(uStack_674,local_7e8);
    local_6a8 = local_7f8;
    uStack_69c = uStack_7f0._4_4_;
    uStack_694 = (undefined4)((ulong)local_7f8 >> 0x20);
    _local_698 = CONCAT44(uStack_694,local_7e8);
    auVar5._4_8_ = uStack_800;
    auVar5._0_4_ = uStack_694;
    auVar37._0_8_ = auVar5._0_8_ << 0x20;
    auVar37._8_4_ = uStack_6a0;
    auVar37._12_4_ = uStack_7f0._4_4_;
    uStack_7f0 = auVar37._8_8_;
    lVar27 = extraout_RDX;
  }
  else {
    iscan_ptr = (int16_t *)&local_7d8;
    puVar26 = &local_808;
    in_stack_fffffffffffff648 = &local_780;
    highbd_calculate_qcoeff
              ((__m128i *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
               (__m128i *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (__m128i *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
               (__m128i *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
               in_stack_fffffffffffff648);
    uStack_6ac = uStack_7d0._4_4_;
    local_6a8 = CONCAT44(local_6a8._4_4_,(int)local_7c8);
    uStack_6bc = uStack_7d0._4_4_;
    uStack_6b4 = (undefined4)((ulong)local_7d8 >> 0x20);
    _local_6b8 = CONCAT44(uStack_6b4,(int)local_7c8);
    auVar6._4_8_ = uVar43;
    auVar6._0_4_ = uStack_6b4;
    auVar33._0_8_ = auVar6._0_8_ << 0x20;
    auVar33._8_4_ = uStack_6c0;
    auVar33._12_4_ = uStack_7d0._4_4_;
    uStack_7d0 = auVar33._8_8_;
    uStack_6cc = uStack_7e0._4_4_;
    local_6c8 = local_7d8;
    uStack_6dc = uStack_7e0._4_4_;
    uStack_6d4 = (undefined4)((ulong)_local_7e8 >> 0x20);
    _local_6d8 = CONCAT44(uStack_6d4,(undefined4)local_7d8);
    auVar7._4_8_ = uStack_7d0;
    auVar7._0_4_ = uStack_6d4;
    auVar38._0_8_ = auVar7._0_8_ << 0x20;
    auVar38._8_4_ = uStack_6e0;
    auVar38._12_4_ = uStack_7e0._4_4_;
    uStack_7e0 = auVar38._8_8_;
    uStack_6ec = uStack_800._4_4_;
    _local_6e8 = CONCAT44(uStack_6d4,(undefined4)local_7f8);
    local_708 = local_808;
    uStack_6fc = uStack_800._4_4_;
    uStack_6f4 = (undefined4)((ulong)local_808 >> 0x20);
    _local_6f8 = CONCAT44(uStack_6f4,(undefined4)local_7f8);
    auVar8._4_8_ = uStack_7e0;
    auVar8._0_4_ = uStack_6f4;
    auVar39._0_8_ = auVar8._0_8_ << 0x20;
    auVar39._8_4_ = uStack_700;
    auVar39._12_4_ = uStack_800._4_4_;
    uStack_800 = auVar39._8_8_;
    puVar28 = &local_868;
    highbd_calculate_qcoeff
              ((__m128i *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
               (__m128i *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (__m128i *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
               (__m128i *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
               in_stack_fffffffffffff648);
    a_00[1] = (longlong)iscan_ptr;
    a_00[0] = (longlong)puVar28;
    sign_01[1] = (longlong)puVar26;
    sign_01[0] = extraout_RDX_00;
    alVar45 = invert_sign_32_sse2(a_00,sign_01);
    sign_02[0] = alVar45[1];
    a_01[1] = (longlong)iscan_ptr;
    a_01[0] = (longlong)puVar28;
    sign_02[1] = (longlong)puVar26;
    local_858 = extraout_XMM0_Qa_01;
    uStack_850 = extraout_XMM0_Qb_01;
    invert_sign_32_sse2(a_01,sign_02);
    local_48 = CONCAT44(iStack_874,local_878);
    uStack_40 = CONCAT44(iStack_86c,iStack_870);
    local_38 = local_858;
    uStack_30 = uStack_850;
    local_858 = local_858 & local_48;
    uStack_850 = uStack_850 & uStack_40;
    local_68 = CONCAT44(iStack_884,local_888);
    uStack_60 = CONCAT44(iStack_87c,iStack_880);
    local_868 = extraout_XMM0_Qa_02 & local_68;
    uStack_860 = extraout_XMM0_Qb_02 & uStack_60;
    *in_stack_00000008 = local_858;
    in_stack_00000008[1] = uStack_850;
    local_150 = in_stack_00000008 + 2;
    *local_150 = local_868;
    in_stack_00000008[3] = uStack_860;
    auVar9._4_8_ = uStack_60;
    auVar9._0_4_ = local_7f8._4_4_;
    auVar40._0_8_ = auVar9._0_8_ << 0x20;
    auVar40._8_4_ = (undefined4)uStack_7f0;
    auVar40._12_4_ = uStack_7f0._4_4_;
    uVar44 = auVar40._8_8_;
    qcoeff_00[0]._4_4_ = in_stack_fffffffffffff664;
    qcoeff_00[0]._0_4_ = in_stack_fffffffffffff660;
    qcoeff_00[1]._0_4_ = in_stack_fffffffffffff668;
    qcoeff_00[1]._4_4_ = in_stack_fffffffffffff66c;
    dequant_00[0]._4_4_ = in_stack_fffffffffffff654;
    dequant_00[0]._0_4_ = in_stack_fffffffffffff650;
    dequant_00[1]._0_4_ = in_stack_fffffffffffff658;
    dequant_00[1]._4_4_ = in_stack_fffffffffffff65c;
    local_168 = local_868;
    uStack_160 = uStack_860;
    local_148 = local_858;
    uStack_140 = uStack_850;
    highbd_calculate_dqcoeff(qcoeff_00,dequant_00,(int)((ulong)in_stack_fffffffffffff648 >> 0x20));
    uStack_70c = uStack_7f0._4_4_;
    local_708 = CONCAT44(local_708._4_4_,local_7e8);
    local_728 = local_7f8;
    uStack_71c = uStack_7f0._4_4_;
    uStack_714 = (undefined4)((ulong)local_7f8 >> 0x20);
    _local_718 = CONCAT44(uStack_714,local_7e8);
    auVar10._4_8_ = uVar44;
    auVar10._0_4_ = uStack_714;
    auVar41._0_8_ = auVar10._0_8_ << 0x20;
    auVar41._8_4_ = uStack_720;
    auVar41._12_4_ = uStack_7f0._4_4_;
    uStack_7f0 = auVar41._8_8_;
    cmp_mask0_00 = (__m128i *)0x0;
    qcoeff_01[0]._4_4_ = in_stack_fffffffffffff664;
    qcoeff_01[0]._0_4_ = in_stack_fffffffffffff660;
    qcoeff_01[1]._0_4_ = in_stack_fffffffffffff668;
    qcoeff_01[1]._4_4_ = in_stack_fffffffffffff66c;
    dequant_01[0]._4_4_ = in_stack_fffffffffffff654;
    dequant_01[0]._0_4_ = in_stack_fffffffffffff650;
    dequant_01[1]._0_4_ = in_stack_fffffffffffff658;
    dequant_01[1]._4_4_ = in_stack_fffffffffffff65c;
    local_818 = extraout_XMM0_Qa_03;
    uStack_810 = extraout_XMM0_Qb_03;
    alVar45 = highbd_calculate_dqcoeff
                        (qcoeff_01,dequant_01,(int)((ulong)in_stack_fffffffffffff648 >> 0x20));
    lVar27 = alVar45[1];
    local_188 = local_818;
    uStack_180 = uStack_810;
    *in_stack_00000010 = local_818;
    in_stack_00000010[1] = uStack_810;
    local_190 = in_stack_00000010 + 2;
    *local_190 = extraout_XMM0_Qa_04;
    in_stack_00000010[3] = extraout_XMM0_Qb_04;
    local_828 = extraout_XMM0_Qa_04;
    uStack_820 = extraout_XMM0_Qb_04;
  }
  while (local_77c < local_758) {
    local_5e0 = (ulong *)((long)local_750 + (long)local_77c * 4);
    local_818 = *local_5e0;
    uStack_810 = local_5e0[1];
    sign_03[1] = (long)local_77c;
    local_5e8 = (ulong *)((long)local_750 + sign_03[1] * 4 + 0x10);
    local_828 = *local_5e8;
    uStack_820 = local_5e8[1];
    local_41c = 0x1f;
    local_418._0_4_ = (int)local_818;
    local_418._4_4_ = (int)(local_818 >> 0x20);
    uStack_410._0_4_ = (int)uStack_810;
    uStack_410._4_4_ = (int)(uStack_810 >> 0x20);
    auVar29 = ZEXT416(0x1f);
    local_838 = (int)local_418 >> auVar29;
    iStack_834 = local_418._4_4_ >> auVar29;
    iStack_830 = (int)uStack_410 >> auVar29;
    iStack_82c = uStack_410._4_4_ >> auVar29;
    local_43c = 0x1f;
    local_438._0_4_ = (int)local_828;
    local_438._4_4_ = (int)(local_828 >> 0x20);
    uStack_430._0_4_ = (int)uStack_820;
    uStack_430._4_4_ = (int)(uStack_820 >> 0x20);
    auVar29 = ZEXT416(0x1f);
    local_848 = (int)local_438 >> auVar29;
    iStack_844 = local_438._4_4_ >> auVar29;
    iStack_840 = (int)uStack_430 >> auVar29;
    iStack_83c = uStack_430._4_4_ >> auVar29;
    a_02[1] = (longlong)iscan_ptr;
    a_02[0] = (longlong)cmp_mask0_00;
    sign_03[0] = lVar27;
    local_438 = local_828;
    uStack_430 = uStack_820;
    local_418 = local_818;
    uStack_410 = uStack_810;
    alVar45 = invert_sign_32_sse2(a_02,sign_03);
    sign_04[0] = alVar45[1];
    a_03[1] = (longlong)iscan_ptr;
    a_03[0] = (longlong)cmp_mask0_00;
    sign_04[1] = sign_03[1];
    local_858 = extraout_XMM0_Qa_05;
    uStack_850 = extraout_XMM0_Qb_05;
    invert_sign_32_sse2(a_03,sign_04);
    local_868 = extraout_XMM0_Qa_06;
    uStack_860 = extraout_XMM0_Qb_06;
    highbd_update_mask0(qcoeff0_00,
                        (__m128i *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
                        (__m128i *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                        (int16_t *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                        (int *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                        (__m128i *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
    local_398 = local_858;
    uVar20 = local_398;
    uStack_390 = uStack_850;
    uVar21 = uStack_390;
    local_3a8 = local_7c8;
    uVar44 = local_3a8;
    uStack_3a0 = uStack_7c0;
    uVar14 = uStack_3a0;
    local_398._0_4_ = (int)local_858;
    local_398._4_4_ = (int)(local_858 >> 0x20);
    uStack_390._0_4_ = (int)uStack_850;
    uStack_390._4_4_ = (int)(uStack_850 >> 0x20);
    local_3a8._0_4_ = (int)local_7c8;
    local_3a8._4_4_ = (int)((ulong)local_7c8 >> 0x20);
    uStack_3a0._0_4_ = (int)uStack_7c0;
    uStack_3a0._4_4_ = (int)((ulong)uStack_7c0 >> 0x20);
    local_878 = -(uint)((int)local_3a8 < (int)local_398);
    iStack_874 = -(uint)(local_3a8._4_4_ < local_398._4_4_);
    iStack_870 = -(uint)((int)uStack_3a0 < (int)uStack_390);
    iStack_86c = -(uint)(uStack_3a0._4_4_ < uStack_390._4_4_);
    local_3b8 = local_868;
    uVar43 = local_3b8;
    uStack_3b0 = uStack_860;
    uVar19 = uStack_3b0;
    local_3c8 = local_7c8;
    uStack_3c0 = uStack_7c0;
    local_3b8._0_4_ = (int)local_868;
    local_3b8._4_4_ = (int)(local_868 >> 0x20);
    uStack_3b0._0_4_ = (int)uStack_860;
    uStack_3b0._4_4_ = (int)(uStack_860 >> 0x20);
    local_888 = -(uint)((int)local_3a8 < (int)local_3b8);
    iStack_884 = -(uint)(local_3a8._4_4_ < local_3b8._4_4_);
    iStack_880 = -(uint)((int)uStack_3a0 < (int)uStack_3b0);
    iStack_87c = -(uint)(uStack_3a0._4_4_ < uStack_3b0._4_4_);
    local_338 = CONCAT44(iStack_874,local_878);
    uStack_330 = CONCAT44(iStack_86c,iStack_870);
    local_348 = CONCAT44(iStack_884,local_888);
    uStack_340 = CONCAT44(iStack_87c,iStack_880);
    auVar12._8_8_ = uStack_330;
    auVar12._0_8_ = local_338;
    auVar11._8_8_ = uStack_340;
    auVar11._0_8_ = local_348;
    local_898 = (__m128i)packssdw(auVar12,auVar11);
    iscan_ptr = _factor + local_77c;
    cmp_mask0_00 = &local_898;
    local_3b8 = uVar43;
    uStack_3b0 = uVar19;
    local_3a8 = uVar44;
    uStack_3a0 = uVar14;
    local_398 = uVar20;
    uStack_390 = uVar21;
    highbd_update_mask1(cmp_mask0_00,iscan_ptr,&local_790,(__m128i *)local_8c8);
    local_2f8 = CONCAT44(iStack_874,local_878);
    uStack_2f0 = CONCAT44(iStack_86c,iStack_870);
    local_308 = CONCAT44(iStack_884,local_888);
    uStack_300 = CONCAT44(iStack_87c,iStack_880);
    local_8c8[4] = local_2f8 | local_308;
    uStack_8a0 = uStack_2f0 | uStack_300;
    auVar13._8_8_ = uStack_8a0;
    auVar13._0_8_ = local_8c8[4];
    local_2c8 = local_8c8[4];
    uStack_2c0 = uStack_8a0;
    if ((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar13 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar13 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar13 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar13 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar13 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar13 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar13 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uStack_8a0 >> 7 & 1) == 0) && (uStack_8a0 >> 0xf & 1) == 0) &&
            (uStack_8a0 >> 0x17 & 1) == 0) && (uStack_8a0 >> 0x1f & 1) == 0) &&
          (uStack_8a0 >> 0x27 & 1) == 0) && (uStack_8a0 >> 0x2f & 1) == 0) &&
        (uStack_8a0 >> 0x37 & 1) == 0) && -1 < (long)uStack_8a0) {
      local_1b0 = (ulong *)((long)in_stack_00000008 + (long)local_77c * 4);
      local_1c8 = local_7a8;
      uStack_1c0 = uStack_7a0;
      *local_1b0 = local_7a8;
      local_1b0[1] = uStack_7a0;
      local_1d0 = (ulong *)((long)in_stack_00000008 + (long)local_77c * 4 + 0x10);
      local_1e8 = local_7a8;
      uStack_1e0 = uStack_7a0;
      *local_1d0 = local_7a8;
      *(ulong *)((long)in_stack_00000008 + (long)local_77c * 4 + 0x18) = uStack_7a0;
      local_1f0 = (ulong *)((long)in_stack_00000010 + (long)local_77c * 4);
      local_208 = local_7a8;
      uStack_200 = uStack_7a0;
      *local_1f0 = local_7a8;
      local_1f0[1] = uStack_7a0;
      local_210 = (ulong *)((long)in_stack_00000010 + (long)local_77c * 4 + 0x10);
      local_228 = local_7a8;
      uStack_220 = uStack_7a0;
      *local_210 = local_7a8;
      *(ulong *)((long)in_stack_00000010 + (long)local_77c * 4 + 0x18) = uStack_7a0;
      local_77c = local_77c + 8;
      lVar27 = extraout_RDX_01;
    }
    else {
      highbd_calculate_qcoeff
                ((__m128i *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 in_stack_fffffffffffff648);
      puVar28 = &local_868;
      iscan_ptr = (int16_t *)&local_7d8;
      puVar26 = &local_808;
      highbd_calculate_qcoeff
                ((__m128i *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 in_stack_fffffffffffff648);
      a_04[1] = (longlong)iscan_ptr;
      a_04[0] = (longlong)puVar28;
      sign_05[1] = (longlong)puVar26;
      sign_05[0] = extraout_RDX_02;
      alVar45 = invert_sign_32_sse2(a_04,sign_05);
      sign_06[0] = alVar45[1];
      a_05[1] = (longlong)iscan_ptr;
      a_05[0] = (longlong)puVar28;
      sign_06[1] = (longlong)puVar26;
      local_858 = extraout_XMM0_Qa_07;
      uStack_850 = extraout_XMM0_Qb_07;
      invert_sign_32_sse2(a_05,sign_06);
      local_88 = CONCAT44(iStack_874,local_878);
      uStack_80 = CONCAT44(iStack_86c,iStack_870);
      local_78 = local_858;
      uStack_70 = uStack_850;
      local_858 = local_858 & local_88;
      uStack_850 = uStack_850 & uStack_80;
      local_a8 = CONCAT44(iStack_884,local_888);
      uStack_a0 = CONCAT44(iStack_87c,iStack_880);
      local_868 = extraout_XMM0_Qa_08 & local_a8;
      uStack_860 = extraout_XMM0_Qb_08 & uStack_a0;
      local_230 = (ulong *)((long)in_stack_00000008 + (long)local_77c * 4);
      *local_230 = local_858;
      local_230[1] = uStack_850;
      local_250 = (ulong *)((long)in_stack_00000008 + (long)local_77c * 4 + 0x10);
      *local_250 = local_868;
      *(ulong *)((long)in_stack_00000008 + (long)local_77c * 4 + 0x18) = uStack_860;
      qcoeff_02[0]._4_4_ = in_stack_fffffffffffff664;
      qcoeff_02[0]._0_4_ = in_stack_fffffffffffff660;
      qcoeff_02[1]._0_4_ = in_stack_fffffffffffff668;
      qcoeff_02[1]._4_4_ = in_stack_fffffffffffff66c;
      dequant_02[0]._4_4_ = in_stack_fffffffffffff654;
      dequant_02[0]._0_4_ = in_stack_fffffffffffff650;
      dequant_02[1]._0_4_ = in_stack_fffffffffffff658;
      dequant_02[1]._4_4_ = in_stack_fffffffffffff65c;
      local_268 = local_868;
      uStack_260 = uStack_860;
      local_248 = local_858;
      uStack_240 = uStack_850;
      highbd_calculate_dqcoeff(qcoeff_02,dequant_02,(int)((ulong)in_stack_fffffffffffff648 >> 0x20))
      ;
      cmp_mask0_00 = (__m128i *)0x0;
      qcoeff_03[0]._4_4_ = in_stack_fffffffffffff664;
      qcoeff_03[0]._0_4_ = in_stack_fffffffffffff660;
      qcoeff_03[1]._0_4_ = in_stack_fffffffffffff668;
      qcoeff_03[1]._4_4_ = in_stack_fffffffffffff66c;
      dequant_03[0]._4_4_ = in_stack_fffffffffffff654;
      dequant_03[0]._0_4_ = in_stack_fffffffffffff650;
      dequant_03[1]._0_4_ = in_stack_fffffffffffff658;
      dequant_03[1]._4_4_ = in_stack_fffffffffffff65c;
      local_818 = extraout_XMM0_Qa_09;
      uStack_810 = extraout_XMM0_Qb_09;
      alVar45 = highbd_calculate_dqcoeff
                          (qcoeff_03,dequant_03,(int)((ulong)in_stack_fffffffffffff648 >> 0x20));
      lVar27 = alVar45[1];
      local_270 = (ulong *)((long)in_stack_00000010 + (long)local_77c * 4);
      *local_270 = local_818;
      local_270[1] = uStack_810;
      local_290 = (ulong *)((long)in_stack_00000010 + (long)local_77c * 4 + 0x10);
      *local_290 = extraout_XMM0_Qa_10;
      *(ulong *)((long)in_stack_00000010 + (long)local_77c * 4 + 0x18) = extraout_XMM0_Qb_10;
      local_77c = local_77c + 8;
      local_828 = extraout_XMM0_Qa_10;
      uStack_820 = extraout_XMM0_Qb_10;
    }
  }
  if (local_78c != 0) {
    mask[1] = (longlong)iscan_ptr;
    mask[0] = (longlong)cmp_mask0_00;
    local_784 = calculate_non_zero_count(mask);
  }
  if (local_790 != 0) {
    mask_00[1] = (longlong)iscan_ptr;
    mask_00[0] = (longlong)cmp_mask0_00;
    local_788 = calculate_non_zero_count(mask_00);
  }
  while (local_788 = local_788 + -1, iVar42 = local_784, local_784 <= local_788) {
    iVar42 = (int)*(short *)(in_stack_00000028 + (long)local_788 * 2);
    *(undefined4 *)((long)in_stack_00000008 + (long)iVar42 * 4) = 0;
    *(undefined4 *)((long)in_stack_00000010 + (long)iVar42 * 4) = 0;
  }
  do {
    iVar42 = iVar42 + -1;
    iVar22 = local_794;
    if (iVar42 < 0) break;
    iVar22 = iVar42;
  } while (*(int *)((long)in_stack_00000008 +
                   (long)(int)*(short *)(in_stack_00000028 + (long)iVar42 * 2) * 4) == 0);
  local_794 = iVar22;
  *in_stack_00000020 = (short)local_794 + 1;
  iVar42 = 0;
  while ((iVar22 = local_91c, iVar42 < local_784 &&
         (iVar22 = iVar42,
         *(int *)((long)in_stack_00000008 +
                 (long)(int)*(short *)(in_stack_00000028 + (long)iVar42 * 2) * 4) == 0))) {
    iVar42 = iVar42 + 1;
  }
  local_91c = iVar22;
  if (((-1 < (int)(*in_stack_00000020 - 1)) && (local_91c == *in_stack_00000020 - 1)) &&
     ((iVar42 = (int)*(short *)(in_stack_00000028 + (long)(int)(*in_stack_00000020 - 1) * 2),
      *(int *)((long)in_stack_00000008 + (long)iVar42 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar42 * 4) == -1)))) {
    uVar24 = *(int *)((long)local_750 + (long)iVar42 * 4) << 5;
    uVar23 = 0;
    if ((int)uVar24 < 0) {
      uVar23 = 0xffffffff;
    }
    if ((int)((uVar24 ^ uVar23) - uVar23) <
        *(short *)(*local_760 + (long)(int)(uint)(iVar42 != 0) * 2) * 0x20 +
        (*(short *)(*in_stack_00000018 + (long)(int)(uint)(iVar42 != 0) * 2) * 0x20d + 0x40 >> 7)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar42 * 4) = 0;
      *(undefined4 *)((long)in_stack_00000010 + (long)iVar42 * 4) = 0;
      *in_stack_00000020 = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 0;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}